

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O1

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::ParenthesisOperator> *op)

{
  element_type *peVar1;
  pointer psVar2;
  ostream *this_00;
  int *__args;
  const_iterator __begin4;
  pointer op_00;
  char local_29;
  int local_28;
  int local_24;
  
  peVar1 = (op->super___shared_ptr<const_calc4::ParenthesisOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  op_00 = (peVar1->operators).
          super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (peVar1->operators).
           super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (op_00 == psVar2) {
    AppendVariableDeclarationBegin(this);
    local_29 = '0';
    std::__ostream_insert<char,std::char_traits<char>>(this->os,&local_29,1);
    AppendVariableDeclarationEnd(this);
    local_28 = this->lastVariableNo;
    __args = &local_28;
  }
  else {
    do {
      local_24 = ProcessOperator(this,op_00);
      op_00 = op_00 + 1;
    } while (op_00 != psVar2);
    if (-1 < local_24) {
      AppendVariableDeclarationBegin(this);
      this_00 = this->os;
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"var_",4);
      std::ostream::operator<<(this_00,local_24);
      AppendVariableDeclarationEnd(this);
    }
    __args = &local_24;
  }
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&(this->stack).c,__args);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const ParenthesisOperator>& op) override
    {
        if (op->GetOperators().empty())
        {
            AppendVariableDeclarationBegin();
            os << '0';
            AppendVariableDeclarationEnd();
            Return();
        }
        else
        {
            int variableNo;

            for (auto& item : op->GetOperators())
            {
                variableNo = ProcessOperator(item);
            }

            if (variableNo >= 0)
            {
                AppendVariableDeclarationBegin();
                os << VariableName(variableNo);
                AppendVariableDeclarationEnd();
            }

            Return(variableNo);
        }
    }